

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O2

bool fileExists(string *filename)

{
  int iVar1;
  bool bVar2;
  string rtrimmed;
  string delims;
  string ftrimmed;
  
  iVar1 = access((filename->_M_dataplus)._M_p,0);
  bVar2 = true;
  if (iVar1 == -1) {
    std::__cxx11::string::string((string *)&delims," \f\n\r\t\v",(allocator *)&rtrimmed);
    std::__cxx11::string::find_last_not_of((string *)filename,(ulong)&delims);
    std::__cxx11::string::substr((ulong)&rtrimmed,(ulong)filename);
    std::__cxx11::string::find_first_not_of((string *)&rtrimmed,(ulong)&delims);
    std::__cxx11::string::substr((ulong)&ftrimmed,(ulong)&rtrimmed);
    iVar1 = access(ftrimmed._M_dataplus._M_p,0);
    bVar2 = iVar1 != -1;
    std::__cxx11::string::~string((string *)&ftrimmed);
    std::__cxx11::string::~string((string *)&rtrimmed);
    std::__cxx11::string::~string((string *)&delims);
  }
  return bVar2;
}

Assistant:

bool fileExists(const std::string& filename)
{
    if (access( filename.c_str(), F_OK ) != -1)
    {
        return true; // file exists
    }
    else
    {
        //std::cout << "access(filename) returned -1 on filename [" << filename << "] I will try trimming." << std::endl;
        std::string delims = " \f\n\r\t\v";
        std::string rtrimmed = filename.substr(0, filename.find_last_not_of(delims) + 1);
        std::string ftrimmed = rtrimmed.substr(rtrimmed.find_first_not_of(delims));
        if (access( ftrimmed.c_str(), F_OK ) != -1)
        {
            return true;
        }
        else
        {
            //std::cout << "Still failed. Cannot find the specified file." << std::endl;
            return false;// file doesn't exist
        }
    }
}